

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int build_cur_mv(int_mv *cur_mv,PREDICTION_MODE this_mode,AV1_COMMON *cm,MACROBLOCK *x,
                int skip_repeated_ref_mv)

{
  int iVar1;
  uint uVar2;
  MV_REFERENCE_FRAME *rf;
  long in_RCX;
  long in_RDI;
  undefined4 in_R8D;
  uint8_t ref_frame_type;
  PREDICTION_MODE single_mode;
  int_mv this_mv;
  int i;
  int ret;
  int is_comp_pred;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  byte in_stack_ffffffffffffffae;
  PREDICTION_MODE in_stack_ffffffffffffffaf;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  MB_MODE_INFO *mbmi_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RCX + 0x2058);
  iVar1 = has_second_ref(mbmi_00);
  uVar5 = 1;
  iVar4 = 0;
  while( true ) {
    if (iVar1 + 1 <= iVar4) {
      return uVar5;
    }
    uVar3 = 0x80008000;
    rf = (MV_REFERENCE_FRAME *)(in_RCX + 0x3c70);
    uVar5 = get_this_mv((int_mv *)CONCAT44(iVar1,uVar5),(PREDICTION_MODE)((uint)iVar4 >> 0x18),
                        -0x7fff8000,
                        CONCAT13(in_stack_ffffffffffffffaf,
                                 CONCAT12(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac)),
                        in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        (MB_MODE_INFO_EXT *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
    if (uVar5 == 0) break;
    in_stack_ffffffffffffffaf =
         get_single_mode((PREDICTION_MODE)((ulong)in_stack_ffffffffffffffa0 >> 0x38),
                         (int)in_stack_ffffffffffffffa0);
    if (in_stack_ffffffffffffffaf == '\x10') {
      in_stack_ffffffffffffffae = av1_ref_frame_type(rf);
      in_stack_ffffffffffffffa0 = (MV_REFERENCE_FRAME *)(in_RDI + (long)iVar4 * 4);
      if (iVar4 == 0) {
        *(undefined4 *)in_stack_ffffffffffffffa0 =
             *(undefined4 *)
              (in_RCX + 0x3c70 + (ulong)in_stack_ffffffffffffffae * 0x20 +
              (ulong)((byte)(*(ushort *)&mbmi_00->field_0xa7 >> 4) & 3) * 8);
      }
      else {
        *(undefined4 *)in_stack_ffffffffffffffa0 =
             *(undefined4 *)
              (in_RCX + (ulong)in_stack_ffffffffffffffae * 0x20 + 0x3c74 +
              (ulong)((byte)(*(ushort *)&mbmi_00->field_0xa7 >> 4) & 3) * 8);
      }
    }
    else {
      uVar2 = clamp_and_check_mv((int_mv *)CONCAT44(iVar1,uVar5),
                                 (int_mv)(uint32_t)((ulong)mbmi_00 >> 0x20),
                                 (AV1_COMMON *)CONCAT44(iVar4,uVar3),
                                 (MACROBLOCK *)
                                 CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8))));
      uVar5 = uVar2 & uVar5;
    }
    iVar4 = iVar4 + 1;
  }
  return 0;
}

Assistant:

static inline int build_cur_mv(int_mv *cur_mv, PREDICTION_MODE this_mode,
                               const AV1_COMMON *cm, const MACROBLOCK *x,
                               int skip_repeated_ref_mv) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);

  int ret = 1;
  for (int i = 0; i < is_comp_pred + 1; ++i) {
    int_mv this_mv;
    this_mv.as_int = INVALID_MV;
    ret = get_this_mv(&this_mv, this_mode, i, mbmi->ref_mv_idx,
                      skip_repeated_ref_mv, mbmi->ref_frame, &x->mbmi_ext);
    if (!ret) return 0;
    const PREDICTION_MODE single_mode = get_single_mode(this_mode, i);
    if (single_mode == NEWMV) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      cur_mv[i] =
          (i == 0) ? x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .this_mv
                   : x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .comp_mv;
    } else {
      ret &= clamp_and_check_mv(cur_mv + i, this_mv, cm, x);
    }
  }
  return ret;
}